

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midimixup.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  string *psVar5;
  MidiEventList *pMVar6;
  MidiEvent *pMVar7;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> notes;
  MidiFile midifile;
  Options options;
  vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_> local_1a8;
  MidiEvent *local_188;
  MidiFile local_180;
  Options local_110;
  
  smf::Options::Options(&local_110,argc,argv);
  checkOptions(&local_110);
  smf::MidiFile::MidiFile(&local_180);
  iVar2 = smf::Options::getArgCount(&local_110);
  if (iVar2 != 2) {
    iVar2 = smf::Options::getArgCount(&local_110);
    if (iVar2 != 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Need one optional MIDI file (or standard input), ",0x31);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"and one output",0xe)
      ;
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      exit(1);
    }
  }
  psVar5 = smf::Options::getArg_abi_cxx11_(&local_110,1);
  smf::MidiFile::read(&local_180,(int)psVar5,__buf,in_RCX);
  smf::MidiFile::linkNotePairs(&local_180);
  local_1a8.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (MidiEvent **)0x0;
  local_1a8.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (MidiEvent **)0x0;
  std::vector<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>::reserve(&local_1a8,0x1e240);
  iVar2 = 0;
  while( true ) {
    iVar3 = smf::MidiFile::getNumTracks(&local_180);
    if (iVar3 <= iVar2) break;
    iVar3 = 0;
    while( true ) {
      iVar4 = smf::MidiFile::getNumEvents(&local_180,iVar2);
      if (iVar4 <= iVar3) break;
      pMVar6 = smf::MidiFile::operator[](&local_180,iVar2);
      pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar3);
      bVar1 = smf::MidiMessage::isNoteOn(&pMVar7->super_MidiMessage);
      if (bVar1) {
        pMVar6 = smf::MidiFile::operator[](&local_180,iVar2);
        pMVar7 = smf::MidiEventList::operator[](pMVar6,iVar3);
        iVar4 = smf::MidiEvent::isLinked(pMVar7);
        if (iVar4 != 0) {
          pMVar6 = smf::MidiFile::operator[](&local_180,iVar2);
          local_188 = smf::MidiEventList::operator[](pMVar6,iVar3);
          if (local_1a8.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              local_1a8.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>>::
            _M_realloc_insert<smf::MidiEvent*>
                      ((vector<smf::MidiEvent*,std::allocator<smf::MidiEvent*>> *)&local_1a8,
                       (iterator)
                       local_1a8.
                       super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_188);
          }
          else {
            *local_1a8.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
             _M_impl.super__Vector_impl_data._M_finish = local_188;
            local_1a8.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 local_1a8.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      iVar3 = iVar3 + 1;
    }
    iVar2 = iVar2 + 1;
  }
  if (reverseQ == 0) {
    randomizeNotes(&local_1a8);
  }
  else {
    reverseNotes(&local_1a8);
  }
  iVar2 = smf::Options::getArgCount(&local_110);
  psVar5 = smf::Options::getArg_abi_cxx11_(&local_110,(iVar2 == 2) + 1);
  smf::MidiFile::write(&local_180,(int)psVar5,__buf_00,in_RCX);
  if (local_1a8.super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1a8.
                    super__Vector_base<smf::MidiEvent_*,_std::allocator<smf::MidiEvent_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  smf::MidiFile::~MidiFile(&local_180);
  smf::Options::~Options(&local_110);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
   Options options(argc, argv);
   checkOptions(options);

   MidiFile midifile;
   if (options.getArgCount() == 2) {
      midifile.read(options.getArg(1));
   } else if (options.getArgCount() == 1) {
      midifile.read(options.getArg(1));
   } else {
      cerr << "Need one optional MIDI file (or standard input), ";
      cerr << "and one output" << endl;
      exit(1);
   }

   midifile.linkNotePairs();
   vector<MidiEvent*> notes;
   notes.reserve(123456);
   int track, event;
   for (track=0; track<midifile.getNumTracks(); track++) {
      for (event=0; event<midifile.getNumEvents(track); event++) {
         if (midifile[track][event].isNoteOn()) {
            if (midifile[track][event].isLinked()) {
               notes.push_back(&midifile[track][event]);
            }
         }
      }
   }

   if (reverseQ) {
      reverseNotes(notes);
   } else {
      randomizeNotes(notes);
   }

   if (options.getArgCount() == 2) {
      midifile.write(options.getArg(2));
   } else {
      midifile.write(options.getArg(1));
   }

   return 0;
}